

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O0

QSize __thiscall
QItemDelegate::sizeHint(QItemDelegate *this,QStyleOptionViewItem *option,QModelIndex *index)

{
  bool bVar1;
  QItemDelegatePrivate *this_00;
  QSize QVar2;
  QModelIndex *in_RDX;
  QRect *in_RSI;
  QRect *in_RDI;
  long in_FS_OFFSET;
  QItemDelegatePrivate *d;
  QRect displayRect;
  QRect checkRect;
  QRect decorationRect;
  QVariant value;
  QRect *in_stack_000000b0;
  QStyleOptionViewItem *in_stack_000000b8;
  QItemDelegate *in_stack_000000c0;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  QRect *decorationRect_00;
  QStyleOptionViewItem *in_stack_ffffffffffffff80;
  QModelIndex *in_stack_ffffffffffffff88;
  QItemDelegatePrivate *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffffa0;
  int role;
  undefined1 in_stack_ffffffffffffffa8 [16];
  QItemDelegate *in_stack_ffffffffffffffb8;
  undefined1 local_38 [16];
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined1 *local_10;
  long local_8;
  
  role = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  decorationRect_00 = in_RDI;
  this_00 = d_func((QItemDelegate *)0x8534ca);
  local_28.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::data(in_RDX,(int)((ulong)this_00 >> 0x20));
  bVar1 = ::QVariant::isValid((QVariant *)in_RDI);
  if (bVar1) {
    QVar2 = qvariant_cast<QSize>
                      ((QVariant *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  }
  else {
    local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = (undefined1  [16])
               rect(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffa8._8_8_,
                    in_stack_ffffffffffffffa8._0_8_,role);
    rect((QItemDelegate *)&DAT_aaaaaaaaaaaaaaaa,in_stack_ffffffffffffffa8._8_8_,
         in_stack_ffffffffffffffa8._0_8_,role);
    QItemDelegatePrivate::displayRect
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
               decorationRect_00,in_RSI);
    doLayout(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,(QRect *)value.d._24_8_,
             (QRect *)value.d.data._16_8_,(bool)value.d.data.data[0xf]);
    QRect::operator|((QRect *)local_38,(QRect *)&stack0xffffffffffffffa8);
    QRect::operator|((QRect *)&stack0xffffffffffffff88,(QRect *)&stack0xffffffffffffffb8);
    QVar2 = QRect::size((QRect *)this_00);
  }
  ::QVariant::~QVariant((QVariant *)&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QSize QItemDelegate::sizeHint(const QStyleOptionViewItem &option,
                              const QModelIndex &index) const
{
    Q_D(const QItemDelegate);
    QVariant value = index.data(Qt::SizeHintRole);
    if (value.isValid())
        return qvariant_cast<QSize>(value);
    QRect decorationRect = rect(option, index, Qt::DecorationRole);
    QRect checkRect = rect(option, index, Qt::CheckStateRole);
    QRect displayRect = d->displayRect(index, option, decorationRect, checkRect);

    doLayout(option, &checkRect, &decorationRect, &displayRect, true);

    return (decorationRect|displayRect|checkRect).size();
}